

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O1

void boost::deflate::inflate_stream_test::testInflate(IDecompressor *d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  size_t extraout_RDX_06;
  size_t extraout_RDX_07;
  size_t extraout_RDX_08;
  size_t extraout_RDX_09;
  size_t extraout_RDX_10;
  size_t extraout_RDX_11;
  size_t extraout_RDX_12;
  size_t sVar2;
  string check;
  Boost local_9c;
  Matrix m;
  string local_70;
  string local_50;
  
  m.level_[0] = 0;
  m.level_[1]._0_2_ = 9;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 0xf;
  m.strategy_[0] = 0;
  m.strategy_[1] = 4;
  paVar1 = &check.field_2;
  check._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&check,
             "{\n   \"AutobahnPython/0.6.0\": {\n      \"1.1.1\": {\n         \"behavior\": \"OK\",\n         \"behaviorClose\": \"OK\",\n         \"duration\": 2,\n         \"remoteCloseCode\": 1000,\n         \"reportfile\": \"autobahnpython_0_6_0_case_1_1_1.json\"\n"
             ,"");
  local_9c.in_ = half;
  local_9c.check_ = half;
  local_9c.flush_ = sync;
  Matrix::operator()(&m,&local_9c,&check);
  sVar2 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)check._M_dataplus._M_p != paVar1) {
    operator_delete(check._M_dataplus._M_p,check.field_2._M_allocated_capacity + 1);
    sVar2 = extraout_RDX_00;
  }
  m.level_[0] = 0;
  m.level_[1]._0_2_ = 9;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 0xf;
  m.strategy_[0] = 0;
  m.strategy_[1] = 4;
  corpus1_abi_cxx11_(&check,(inflate_stream_test *)0x1388,sVar2);
  local_9c.in_ = half;
  local_9c.check_ = half;
  local_9c.flush_ = sync;
  Matrix::operator()(&m,&local_9c,&check);
  sVar2 = extraout_RDX_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)check._M_dataplus._M_p != paVar1) {
    operator_delete(check._M_dataplus._M_p,check.field_2._M_allocated_capacity + 1);
    sVar2 = extraout_RDX_02;
  }
  m.level_[0] = 0;
  m.level_[1]._0_2_ = 9;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 0xf;
  m.strategy_[0] = 0;
  m.strategy_[1] = 4;
  corpus2_abi_cxx11_(&check,(inflate_stream_test *)0x1388,sVar2);
  local_9c.in_ = half;
  local_9c.check_ = half;
  local_9c.flush_ = sync;
  Matrix::operator()(&m,&local_9c,&check);
  sVar2 = extraout_RDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)check._M_dataplus._M_p != paVar1) {
    operator_delete(check._M_dataplus._M_p,check.field_2._M_allocated_capacity + 1);
    sVar2 = extraout_RDX_04;
  }
  m.level_[0] = 0;
  m.level_[1]._0_2_ = 9;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 0xf;
  m.strategy_[0] = 0;
  m.strategy_[1] = 4;
  corpus1_abi_cxx11_(&check,(inflate_stream_test *)0x3e8,sVar2);
  m.level_[0] = 6;
  m.level_[1]._0_2_ = 6;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 9;
  m.strategy_[0] = 0;
  m.strategy_[1] = 0;
  local_9c.in_ = once;
  local_9c.check_ = full;
  local_9c.flush_ = sync;
  Matrix::operator()(&m,&local_9c,&check);
  sVar2 = extraout_RDX_05;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)check._M_dataplus._M_p != paVar1) {
    operator_delete(check._M_dataplus._M_p,check.field_2._M_allocated_capacity + 1);
    sVar2 = extraout_RDX_06;
  }
  m.level_[0] = 0;
  m.level_[1]._0_2_ = 9;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 0xf;
  m.strategy_[0] = 0;
  m.strategy_[1] = 4;
  corpus2_abi_cxx11_(&check,(inflate_stream_test *)0x3e8,sVar2);
  m.level_[0] = 6;
  m.level_[1]._0_2_ = 6;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 9;
  m.strategy_[0] = 0;
  m.strategy_[1] = 0;
  local_9c.in_ = once;
  local_9c.check_ = full;
  local_9c.flush_ = sync;
  Matrix::operator()(&m,&local_9c,&check);
  sVar2 = extraout_RDX_07;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)check._M_dataplus._M_p != paVar1) {
    operator_delete(check._M_dataplus._M_p,check.field_2._M_allocated_capacity + 1);
    sVar2 = extraout_RDX_08;
  }
  m.strategy_[1] = 4;
  m.level_[0] = 6;
  m.level_[1]._0_2_ = 6;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 9;
  m.strategy_[0] = 0;
  corpus1_abi_cxx11_(&check,(inflate_stream_test *)0xc8,sVar2);
  local_9c.in_ = full;
  local_9c.check_ = full;
  local_9c.flush_ = sync;
  Matrix::operator()(&m,&local_9c,&check);
  sVar2 = extraout_RDX_09;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)check._M_dataplus._M_p != paVar1) {
    operator_delete(check._M_dataplus._M_p,check.field_2._M_allocated_capacity + 1);
    sVar2 = extraout_RDX_10;
  }
  m.strategy_[1] = 4;
  m.level_[0] = 6;
  m.level_[1]._0_2_ = 6;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 9;
  m.strategy_[0] = 0;
  corpus2_abi_cxx11_(&check,(inflate_stream_test *)0x1f4,sVar2);
  local_9c.in_ = full;
  local_9c.check_ = full;
  local_9c.flush_ = sync;
  Matrix::operator()(&m,&local_9c,&check);
  sVar2 = extraout_RDX_11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)check._M_dataplus._M_p != paVar1) {
    operator_delete(check._M_dataplus._M_p,check.field_2._M_allocated_capacity + 1);
    sVar2 = extraout_RDX_12;
  }
  m.level_[0] = 0;
  m.level_[1]._0_2_ = 9;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 0xf;
  m.strategy_[0] = 0;
  m.strategy_[1] = 4;
  corpus2_abi_cxx11_(&check,(inflate_stream_test *)0x3e8,sVar2);
  m.level_[0] = 6;
  m.level_[1]._0_2_ = 6;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 9;
  m.strategy_[0] = 0;
  m.strategy_[1] = 0;
  local_9c.in_ = full;
  local_9c.check_ = once;
  local_9c.flush_ = block;
  Matrix::operator()(&m,&local_9c,&check);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)check._M_dataplus._M_p != paVar1) {
    operator_delete(check._M_dataplus._M_p,check.field_2._M_allocated_capacity + 1);
  }
  m.level_[0] = 6;
  m.level_[1]._0_2_ = 6;
  m.level_[1]._2_2_ = 0;
  m.window_[0] = 9;
  m.window_[1] = 9;
  m.strategy_[0] = 0;
  m.strategy_[1] = 0;
  local_9c.in_ = full;
  local_9c.check_ = full;
  local_9c.flush_ = sync;
  check._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&check,
             "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. Ultricies mi eget mauris pharetra et ultrices neque ornare. Eget est lorem ipsum dolor. Dui faucibus in ornare quam viverra orci sagittis. Lorem mollis aliquam ut porttitor. Pretium quam vulputate dignissim suspendisse in est ante in. Tempus egestas sed sed risus pretium quam vulputate dignissim. Pellentesque dignissim enim sit amet venenatis urna. Eleifend quam adipiscing vitae proin sagittis nisl rhoncus. Aliquam etiam erat velit scelerisque in. Accumsan in nisl nisi scelerisque eu ultrices vitae auctor eu."
             ,"");
  Matrix::operator()(&m,&local_9c,&check);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)check._M_dataplus._M_p != paVar1) {
    operator_delete(check._M_dataplus._M_p,check.field_2._M_allocated_capacity + 1);
  }
  m.level_[0] = 0x40051863;
  m.level_[1]._0_2_ = 0xc;
  check._M_string_length = 6;
  check._M_dataplus._M_p = (pointer)&m;
  check_abi_cxx11_(&local_50,(inflate_stream_test *)d,(IDecompressor *)&check,
                   (initializer_list<unsigned_char> *)0x0,(error_code)ZEXT816(0x12b5c8),8,3,
                   (size_t)&m);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  check.field_2._M_allocated_capacity = 0;
  check.field_2._8_6_ = 0;
  check.field_2._14_2_ = 0;
  check._M_dataplus._M_p = (pointer)0x800000000081c0ed;
  check._M_string_length = 0xa917a9fda0;
  m.level_[0] = (int)&check;
  m.level_[1]._0_2_ = (undefined2)((ulong)&check >> 0x20);
  m.level_[1]._2_2_ = (undefined2)((ulong)&check >> 0x30);
  m.window_[0] = 0x2e;
  m.window_[1] = 0;
  check_abi_cxx11_(&local_70,(inflate_stream_test *)d,(IDecompressor *)&m,
                   (initializer_list<unsigned_char> *)0x0,(error_code)ZEXT816(0x12b5c8),0xf,
                   0xffffffffffffffff,0x800000000081c0ed);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static
    void testInflate(IDecompressor& d)
    {
        {
            Matrix m{};
            std::string check =
                "{\n   \"AutobahnPython/0.6.0\": {\n"
                "      \"1.1.1\": {\n"
                "         \"behavior\": \"OK\",\n"
                "         \"behaviorClose\": \"OK\",\n"
                "         \"duration\": 2,\n"
                "         \"remoteCloseCode\": 1000,\n"
                "         \"reportfile\": \"autobahnpython_0_6_0_case_1_1_1.json\"\n"
                ;
            m(Boost{half, half}, check);
        }

        {
            Matrix m{};
            auto const check = corpus1(5000);
            m(Boost{half, half}, check);
        }
        {
            Matrix m{};
            auto const check = corpus2(5000);
            m(Boost{half, half}, check);
        }
        {
            Matrix m{};
            auto const check = corpus1(1000);
            m.level(6);
            m.window(9);
            m.strategy(Z_DEFAULT_STRATEGY);
            m(Boost{once, full}, check);
        }
        {
            Matrix m{};
            auto const check = corpus2(1000);
            m.level(6);
            m.window(9);
            m.strategy(Z_DEFAULT_STRATEGY);
            m(Boost{once, full}, check);
        }
        {
            Matrix m{};
            m.level(6);
            m.window(9);
            auto const check = corpus1(200);
            m(Boost{full, full}, check);
        }
        {
            Matrix m{};
            m.level(6);
            m.window(9);
            auto const check = corpus2(500);
            m(Boost{full, full}, check);
        }
        {
            Matrix m{};
            auto const check = corpus2(1000);
            m.level(6);
            m.window(9);
            m.strategy(Z_DEFAULT_STRATEGY);
            m(Boost{full, once, Flush::block}, check);
        }
        {
            // Check a known string - this provides more stable coverage,
            // independent of the RNG-generated strings.
            Matrix m{};
            auto const check =
                "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do "
                "eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                "Ultricies mi eget mauris pharetra et ultrices neque ornare. Eget est "
                "lorem ipsum dolor. Dui faucibus in ornare quam viverra orci "
                "sagittis. Lorem mollis aliquam ut porttitor. Pretium quam vulputate "
                "dignissim suspendisse in est ante in. Tempus egestas sed sed risus "
                "pretium quam vulputate dignissim. Pellentesque dignissim enim sit "
                "amet venenatis urna. Eleifend quam adipiscing vitae proin sagittis "
                "nisl rhoncus. Aliquam etiam erat velit scelerisque in. Accumsan in "
                "nisl nisi scelerisque eu ultrices vitae auctor eu.";
            m.level(6);
            m.window(9);
            m.strategy(Z_DEFAULT_STRATEGY);
            m(Boost{full, full}, check);
        }

// ASTUN: Always fails on AppleClang and MSVC; still not sure why
#if 0
        {
            Matrix m{};
            auto const check2 = corpus2(10000);
            //auto const check2 = std::string{"Text"};
            m.level(6);
            m.window(9);
            m.strategy(Z_DEFAULT_STRATEGY);
            m(Boost{full, once, Flush::trees}, check2);
        }
#endif
        check(d, {0x63, 0x18, 0x05, 0x40, 0x0c, 0x00}, {},boost::deflate::wrap::none, 8, 3);
        check(d, {0xed, 0xc0, 0x81, 0x00, 0x00, 0x00, 0x00, 0x80,
               0xa0, 0xfd, 0xa9, 0x17, 0xa9, 0x00, 0x00, 0x00,
               0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
               0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
               0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
               0x00, 0x00, 0x00, 0x00, 0x00, 0x06}, {});
    }